

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::container_internal::
raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
::begin(raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
        *this)

{
  anon_union_8_1_a8a14541_for_iterator_2 in_RDX;
  iterator iVar1;
  iterator it;
  iterator local_18;
  
  if ((this->settings_).
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::CommonFields,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::container_internal::CommonFields,_0UL,_false>.value.size_ < 2) {
    local_18.ctrl_ = (ctrl_t *)0x0;
  }
  else {
    iterator::iterator(&local_18,
                       (this->settings_).
                       super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::CommonFields,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .super_Storage<absl::container_internal::CommonFields,_0UL,_false>.value.
                       heap_or_soo_.heap.control,
                       (this->settings_).
                       super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::CommonFields,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .super_Storage<absl::container_internal::CommonFields,_0UL,_false>.value.
                       heap_or_soo_.heap.slot_array,(GenerationType *)0x0);
    iterator::skip_empty_or_deleted(&local_18);
    in_RDX = local_18.field_1;
    if (*local_18.ctrl_ < ~kSentinel) {
      __assert_fail("IsFull(*it.control())",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xaf0,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, absl::CommandLineFlag *>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, absl::CommandLineFlag *>>>::begin() [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, absl::CommandLineFlag *>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, absl::CommandLineFlag *>>]"
                   );
    }
  }
  iVar1.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_2)(anon_union_8_1_a8a14541_for_iterator_2)in_RDX.slot_;
  iVar1.ctrl_ = local_18.ctrl_;
  return iVar1;
}

Assistant:

bool empty() const { return !size(); }